

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

void __thiscall
tonk::Connection::queueAddressAndIdChangeMessage(Connection *this,UDPAddress *peerUDPAddress)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  const_reference pvVar4;
  address_v6 *paVar5;
  const_reference pvVar6;
  size_type sVar7;
  long in_RDI;
  bytes_type bVar8;
  size_t i_1;
  bytes_type addrData_1;
  address_v6 v6addr;
  size_t i;
  bytes_type addrData;
  address_v4 v4addr;
  address ipaddr;
  size_t written;
  uint8_t data [22];
  LogStringBuffer buffer;
  basic_endpoint<asio::ip::udp> *in_stack_fffffffffffffc48;
  address_v6 *in_stack_fffffffffffffc50;
  SessionOutgoing *in_stack_fffffffffffffc58;
  undefined8 local_3a0;
  address *in_stack_fffffffffffffc78;
  address_v6 *local_330;
  array<unsigned_char,_16UL> local_328 [2];
  ulong local_300;
  array<unsigned_char,_4UL> local_2f8 [2];
  address local_2f0;
  size_t local_2d0;
  value_type_conflict local_2b8;
  undefined2 local_2b7;
  undefined1 local_2b5;
  unsigned_short local_2b4 [25];
  unsigned_short local_282;
  unsigned_short *local_280;
  undefined4 local_274;
  undefined2 *local_270;
  undefined2 local_262;
  undefined2 *local_260;
  
  local_2b8 = 0x80;
  local_270 = &local_2b7;
  local_274 = *(undefined4 *)(in_RDI + 0xc900);
  local_2b5 = (undefined1)((uint)local_274 >> 0x10);
  local_262 = (undefined2)local_274;
  local_260 = local_270;
  local_2b7 = local_262;
  local_282 = asio::ip::basic_endpoint<asio::ip::udp>::port
                        ((basic_endpoint<asio::ip::udp> *)0x19f560);
  local_2d0 = 6;
  local_280 = local_2b4;
  local_2b4[0] = local_282;
  asio::ip::basic_endpoint<asio::ip::udp>::address(in_stack_fffffffffffffc48);
  bVar2 = asio::ip::address::is_v4(&local_2f0);
  if (bVar2) {
    asio::ip::address::to_v4(in_stack_fffffffffffffc78);
    local_2f8[0]._M_elems =
         (_Type)asio::ip::address_v4::to_bytes((address_v4 *)in_stack_fffffffffffffc48);
    for (local_300 = 0; uVar1 = local_300, sVar7 = std::array<unsigned_char,_4UL>::size(local_2f8),
        uVar1 < sVar7; local_300 = local_300 + 1) {
      pvVar4 = std::array<unsigned_char,_4UL>::operator[]
                         ((array<unsigned_char,_4UL> *)in_stack_fffffffffffffc50,
                          (size_type)in_stack_fffffffffffffc48);
      (&local_2b8)[local_2d0 + local_300] = *pvVar4;
    }
    sVar7 = std::array<unsigned_char,_4UL>::size(local_2f8);
    local_2d0 = sVar7 + local_2d0;
  }
  else {
    bVar2 = asio::ip::address::is_v6(&local_2f0);
    if (!bVar2) {
      return;
    }
    asio::ip::address::to_v6(in_stack_fffffffffffffc78);
    bVar8 = asio::ip::address_v6::to_bytes(in_stack_fffffffffffffc50);
    local_330 = (address_v6 *)0x0;
    local_328[0]._M_elems = bVar8._M_elems;
    while( true ) {
      in_stack_fffffffffffffc58 = bVar8._M_elems._8_8_;
      local_3a0 = bVar8._M_elems._0_8_;
      in_stack_fffffffffffffc50 = local_330;
      paVar5 = (address_v6 *)std::array<unsigned_char,_16UL>::size(local_328);
      if (paVar5 <= in_stack_fffffffffffffc50) break;
      pvVar6 = std::array<unsigned_char,_16UL>::operator[]
                         ((array<unsigned_char,_16UL> *)in_stack_fffffffffffffc50,
                          (size_type)in_stack_fffffffffffffc48);
      bVar8._M_elems._8_8_ = in_stack_fffffffffffffc58;
      bVar8._M_elems[0] = (undefined1)local_3a0;
      bVar8._M_elems[1] = local_3a0._1_1_;
      bVar8._M_elems[2] = local_3a0._2_1_;
      bVar8._M_elems[3] = local_3a0._3_1_;
      bVar8._M_elems[4] = local_3a0._4_1_;
      bVar8._M_elems[5] = local_3a0._5_1_;
      bVar8._M_elems[6] = local_3a0._6_1_;
      bVar8._M_elems[7] = local_3a0._7_1_;
      (&local_2b8)[(long)&(local_330->addr_).__in6_u + local_2d0] = *pvVar6;
      local_330 = (address_v6 *)((long)&(local_330->addr_).__in6_u + 1);
    }
    sVar7 = std::array<unsigned_char,_16UL>::size(local_328);
    local_2d0 = sVar7 + local_2d0;
  }
  iVar3 = memcmp((void *)(in_RDI + 0xc90c),&local_2b8,local_2d0);
  if (iVar3 != 0) {
    SessionOutgoing::QueueControl
              (in_stack_fffffffffffffc58,(uint8_t *)in_stack_fffffffffffffc50,
               (size_t)in_stack_fffffffffffffc48);
    Result::~Result((Result *)in_stack_fffffffffffffc50);
    memcpy((void *)(in_RDI + 0xc90c),&local_2b8,local_2d0);
  }
  return;
}

Assistant:

void Connection::queueAddressAndIdChangeMessage(const UDPAddress& peerUDPAddress)
{
    try
    {
        uint8_t data[protocol::kMaxClientIdAndAddressBytes];

        data[0] = protocol::ControlChannel_S2C_ClientIdAndAddress;
        siamese::WriteU24_LE(data + 1, LocallyAssignedIdForRemoteHost);
        siamese::WriteU16_LE(data + 1 + 3, peerUDPAddress.port());
        size_t written = 1 + 3 + 2;

        const asio::ip::address ipaddr = peerUDPAddress.address();
        if (ipaddr.is_v4())
        {
            const asio::ip::address_v4 v4addr = ipaddr.to_v4();
            const auto addrData = v4addr.to_bytes();
            for (size_t i = 0; i < addrData.size(); ++i) {
                data[written + i] = addrData[i];
            }
            written += addrData.size(); // Length implies IPv4
        }
        else if (ipaddr.is_v6())
        {
            const asio::ip::address_v6 v6addr = ipaddr.to_v6();
            const auto addrData = v6addr.to_bytes();
            for (size_t i = 0; i < addrData.size(); ++i) {
                data[written + i] = addrData[i];
            }
            written += addrData.size(); // Length implies IPv6
        }
        else
        {
            TONK_DEBUG_BREAK();
            return;
        }

        TONK_DEBUG_ASSERT(written <= protocol::kMaxClientIdAndAddressBytes);

        // Note: Sometimes the same IP:port can be contacted twice in a row
        // from e.g. hostname resolution.  Avoid queuing the same data twice.
        if (0 != memcmp(LastIdAndAddressSent, data, written))
        {
            Outgoing.QueueControl(data, written);
            memcpy(LastIdAndAddressSent, data, written);
        }
    }
    catch (...)
    {
        Logger.Error("queueAddressAndIdChangeMessage: Exception while converting IP address");
    }
}